

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O3

void __thiscall
SparseArray_Equal3_Test<unsigned_short>::TestBody(SparseArray_Equal3_Test<unsigned_short> *this)

{
  ushort uVar1;
  int iVar2;
  pointer *__ptr;
  char *in_R9;
  AssertHelper AStack_88;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  undefined1 local_78 [8];
  undefined1 local_70 [8];
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  string local_58;
  undefined8 local_38;
  undefined4 local_30;
  
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length._0_4_ = 1;
  local_58.field_2._M_allocated_capacity = 2;
  local_58.field_2._8_4_ = 2;
  local_38 = 5;
  local_30 = 4;
  pstore::sparse_array<int,unsigned_short>::make_unique<std::pair<unsigned_long,int>const*>
            ((pair<unsigned_long,_int> *)local_70,(pair<unsigned_long,_int> *)&local_58);
  local_58._M_dataplus._M_p = (char *)0x0;
  local_58._M_string_length._0_4_ = 0;
  local_58.field_2._M_allocated_capacity = 2;
  local_58.field_2._8_4_ = 2;
  local_38 = 4;
  local_30 = 4;
  pstore::sparse_array<int,unsigned_short>::make_unique<std::pair<unsigned_long,int>const*>
            ((pair<unsigned_long,_int> *)local_78,(pair<unsigned_long,_int> *)&local_58);
  uVar1 = *(ushort *)local_70;
  if (uVar1 == *(ushort *)local_78) {
    if (uVar1 == 0) {
      local_68[0] = (internal)0x0;
    }
    else {
      iVar2 = bcmp((ushort *)((long)local_70 + 4),(ushort *)((long)local_78 + 4),
                   (ulong)(uint)(POPCOUNT((uint)uVar1) << 2));
      local_68[0] = (internal)(iVar2 != 0);
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_68[0]) goto LAB_00190fa9;
    }
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,local_68,(AssertionResult *)"*arr1 == *arr2","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x103,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&AStack_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
  }
LAB_00190fa9:
  if (local_78 != (undefined1  [8])0x0) {
    operator_delete((void *)local_78);
  }
  if (local_70 != (undefined1  [8])0x0) {
    operator_delete((void *)local_70);
  }
  return;
}

Assistant:

TYPED_TEST (SparseArray, Equal3) {
    auto arr1 = sparse_array<int, TypeParam>::make_unique ({{0, 1}, {2, 2}, {5, 4}});
    auto arr2 = sparse_array<int, TypeParam>::make_unique ({{0, 0}, {2, 2}, {4, 4}});
    EXPECT_FALSE (*arr1 == *arr2);
}